

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

bool CoreML::hasIOS13NeuralNetworkFeatures(Model *model)

{
  SupportVectorClassifier *pSVar1;
  bool bVar2;
  uint32 uVar3;
  NeuralNetworkRegressor *pNVar4;
  NeuralNetworkClassifier *pNVar5;
  Type *layer;
  int index;
  
  uVar3 = model->_oneof_case_[0];
  if (uVar3 == 0x12f) {
    pNVar4 = (model->Type_).neuralnetworkregressor_;
LAB_0027f266:
    if (pNVar4->arrayinputshapemapping_ != 0) {
      return true;
    }
    if (model->_oneof_case_[0] == 0x12f) {
      pNVar4 = (model->Type_).neuralnetworkregressor_;
    }
    else {
      pNVar4 = Specification::NeuralNetworkRegressor::default_instance();
    }
    if (pNVar4->imageinputshapemapping_ != 0) {
      return true;
    }
    if (model->_oneof_case_[0] == 0x193) goto LAB_0027f29e;
    pNVar5 = Specification::NeuralNetworkClassifier::default_instance();
  }
  else {
    if (uVar3 != 0x193) {
      if (uVar3 != 500) goto LAB_0027f2c8;
      if (((model->Type_).neuralnetworkregressor_)->arrayinputshapemapping_ != 0) {
        return true;
      }
      if (((model->Type_).neuralnetworkregressor_)->imageinputshapemapping_ != 0) {
        return true;
      }
      pNVar4 = Specification::NeuralNetworkRegressor::default_instance();
      goto LAB_0027f266;
    }
LAB_0027f29e:
    pNVar5 = (NeuralNetworkClassifier *)(model->Type_).neuralnetworkregressor_;
  }
  if (pNVar5->arrayinputshapemapping_ != 0) {
    return true;
  }
  if (model->_oneof_case_[0] == 0x193) {
    pNVar5 = (NeuralNetworkClassifier *)(model->Type_).glmclassifier_;
  }
  else {
    pNVar5 = Specification::NeuralNetworkClassifier::default_instance();
  }
  if (pNVar5->imageinputshapemapping_ != 0) {
    return true;
  }
  uVar3 = model->_oneof_case_[0];
LAB_0027f2c8:
  if (((uVar3 == 0x12f) || (uVar3 == 500)) || (uVar3 == 0x193)) {
    pSVar1 = (model->Type_).supportvectorclassifier_;
    index = 0;
    if (0 < *(int *)&(pSVar1->numberofsupportvectorsperclass_).rep_) {
      do {
        layer = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          ((RepeatedPtrFieldBase *)&pSVar1->numberofsupportvectorsperclass_,index);
        bVar2 = isIOS12NeuralNetworkLayer(layer);
        if (!bVar2) break;
        index = index + 1;
      } while (index < *(int *)&(pSVar1->numberofsupportvectorsperclass_).rep_);
      return !bVar2;
    }
  }
  return false;
}

Assistant:

bool CoreML::hasIOS13NeuralNetworkFeatures(const Specification::Model& model) {

    /* check if any of the messages in NeuralNetwork.proto, that were added in iOS version 13, are being used.
      If they are, return True, otherwise return False.

     In particular, check for the presence of the following messages:
     1. any new layer type, which was not in iOS 12.
     2. if the value of enums "NeuralNetworkMultiArrayShapeMapping" or "NeuralNetworkImageShapeMapping" is non 0
     */

    switch (model.Type_case()) {
        case Specification::Model::TypeCase::kNeuralNetwork:
            if (model.neuralnetwork().arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                return true;
            }
            if (model.neuralnetwork().imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                return true;
            }
        case Specification::Model::TypeCase::kNeuralNetworkRegressor:
            if (model.neuralnetworkregressor().arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                return true;
            }
            if (model.neuralnetworkregressor().imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                return true;
            }
        case Specification::Model::TypeCase::kNeuralNetworkClassifier:
            if (model.neuralnetworkclassifier().arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                return true;
            }
            if (model.neuralnetworkclassifier().imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                return true;
            }
        default:
            break;
    }

    // check for new layers: by checking if its NOT one of the layers supported in iOS 12
    auto layers = getNNSpec(model);
    if (layers) {
        for (int i=0; i< layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            if (!isIOS12NeuralNetworkLayer(layer)) {
                return true;
            }
        }
    }

    return false;
}